

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.hpp
# Opt level: O0

void __thiscall
SoapySDR::Device::writeSetting<char_const*>
          (Device *this,int direction,size_t channel,string *key,char **value)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  char **in_stack_ffffffffffffff78;
  string local_48 [72];
  
  SettingToString<char_const*>(in_stack_ffffffffffffff78);
  (**(code **)(*in_RDI + 0x350))(in_RDI,in_ESI,in_RDX,in_RCX,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void SoapySDR::Device::writeSetting(const int direction, const size_t channel, const std::string &key, const Type &value)
{
    this->writeSetting(direction, channel, key, SoapySDR::SettingToString(value));
}